

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O1

ion_err_t oah_find_item_loc(ion_hashmap_t *hash_map,ion_key_t key,int *location)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ion_err_t unaff_R12B;
  
  iVar4 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  uVar7 = (long)iVar4 % (long)hash_map->map_size & 0xffffffff;
  iVar4 = 0;
  do {
    if (iVar4 == hash_map->map_size) {
      return '\x01';
    }
    iVar1 = (hash_map->super).record.key_size;
    iVar6 = (int)uVar7;
    lVar5 = (long)(((hash_map->super).record.value_size + iVar1 + 1) * iVar6);
    cVar3 = hash_map->entry[lVar5];
    if (cVar3 == -2) {
LAB_00108408:
      iVar4 = iVar4 + 1;
      uVar7 = (ulong)(iVar6 + 1U);
      if (hash_map->map_size <= (int)(iVar6 + 1U)) {
        uVar7 = 0;
      }
      bVar2 = true;
    }
    else if (cVar3 == -1) {
      bVar2 = false;
      unaff_R12B = '\x01';
    }
    else {
      cVar3 = (*(hash_map->super).compare)(hash_map->entry + lVar5 + 1,key,iVar1);
      if (cVar3 != '\0') goto LAB_00108408;
      *location = iVar6;
      unaff_R12B = '\0';
      bVar2 = false;
    }
    if (!bVar2) {
      return unaff_R12B;
    }
  } while( true );
}

Assistant:

ion_err_t
oah_find_item_loc(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	int				*location
) {
	/* compute hash value for given key */
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);

	int loc			= oah_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	while (count != hash_map->map_size) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if (item->status == ION_EMPTY) {
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					return err_ok;
				}
			}

			count++;
			loc++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
			}
		}
	}

	return err_item_not_found;	/* key have not been found */
}